

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void last_valueFinalizeFunc(sqlite3_context *pCtx)

{
  char *pcVar1;
  
  if ((short)pCtx->pMem->flags < 0) {
    pcVar1 = pCtx->pMem->z;
  }
  else {
    pcVar1 = (char *)createAggContext(pCtx,0x10);
  }
  if ((pcVar1 != (char *)0x0) && (*(sqlite3_value **)pcVar1 != (sqlite3_value *)0x0)) {
    sqlite3_result_value(pCtx,*(sqlite3_value **)pcVar1);
    sqlite3ValueFree(*(sqlite3_value **)pcVar1);
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
  }
  return;
}

Assistant:

static void last_valueFinalizeFunc(sqlite3_context *pCtx){
  struct LastValueCtx *p;
  p = (struct LastValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p && p->pVal ){
    sqlite3_result_value(pCtx, p->pVal);
    sqlite3_value_free(p->pVal);
    p->pVal = 0;
  }
}